

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::
AppendSize<google::protobuf::internal::EpsCopyInputStream::AppendStringFallback(char_const*,int,std::__cxx11::string*)::__0>
          (EpsCopyInputStream *this,char *ptr,int size,anon_class_8_1_ba1d7991 *append)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  pair<const_char_*,_bool> pVar1;
  pair<const_char_*,_bool> res;
  int chunk_size;
  int in_stack_00000284;
  char *in_stack_00000288;
  EpsCopyInputStream *in_stack_00000290;
  char *in_stack_ffffffffffffff48;
  anon_class_8_1_ba1d7991 *in_stack_ffffffffffffff50;
  int local_2c;
  int local_1c;
  
  local_2c = ((int)*(undefined8 *)(in_RDI + 8) + 0x10) - in_ESI;
  local_1c = in_EDX;
  while( true ) {
    AppendStringFallback::anon_class_8_1_ba1d7991::operator()
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
    local_1c = local_1c - local_2c;
    if (*(int *)(in_RDI + 0x1c) == 0x10) {
      return (char *)0x0;
    }
    pVar1 = DoneFallback(in_stack_00000290,in_stack_00000288,in_stack_00000284);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    local_2c = ((int)*(undefined8 *)(in_RDI + 8) + 0x10) - (int)pVar1.first;
    if (local_1c <= local_2c) {
      AppendStringFallback::anon_class_8_1_ba1d7991::operator()
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
      return pVar1.first + local_1c;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* AppendSize(const char* ptr, int size, const A& append) {
    int chunk_size = buffer_end_ + kSlopBytes - ptr;
    do {
      GOOGLE_DCHECK(size > chunk_size);
      append(ptr, chunk_size);
      ptr += chunk_size;
      size -= chunk_size;
      // DoneFallBack asserts it isn't called when exactly on the limit. If this
      // happens we fail the parse, as we are at the limit and still more bytes
      // to read.
      if (limit_ == kSlopBytes) return nullptr;
      auto res = DoneFallback(ptr, -1);
      if (res.second) return nullptr;  // If done we passed the limit
      ptr = res.first;
      chunk_size = buffer_end_ + kSlopBytes - ptr;
    } while (size > chunk_size);
    append(ptr, size);
    return ptr + size;
  }